

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdatastream.h
# Opt level: O3

QDataStream *
QtPrivate::writeAssociativeContainer<QMap<QString,QVariant>>
          (QDataStream *s,QMap<QString,_QVariant> *c)

{
  QMapData<std::map<QString,_QVariant,_std::less<QString>,_std::allocator<std::pair<const_QString,_QVariant>_>_>_>
  *pQVar1;
  QDataStream *pQVar2;
  _Rb_tree_node_base *p_Var3;
  qint32 i;
  size_t i_00;
  _Rb_tree_node_base *p_Var4;
  
  pQVar1 = (c->d).d.ptr;
  if (pQVar1 == (QMapData<std::map<QString,_QVariant,_std::less<QString>,_std::allocator<std::pair<const_QString,_QVariant>_>_>_>
                 *)0x0) {
    i_00 = 0;
LAB_002a95f9:
    i = (qint32)i_00;
  }
  else {
    i_00 = (pQVar1->m)._M_t._M_impl.super__Rb_tree_header._M_node_count;
    if ((long)i_00 < 0xfffffffe) goto LAB_002a95f9;
    if (0x15 < s->ver) {
      pQVar2 = QDataStream::operator<<(s,-2);
      QDataStream::operator<<(pQVar2,i_00);
      goto LAB_002a9604;
    }
    if (i_00 != 0xfffffffe) {
      QDataStream::setStatus(s,SizeLimitExceeded);
      return s;
    }
    i = -2;
  }
  QDataStream::operator<<(s,i);
LAB_002a9604:
  pQVar1 = (c->d).d.ptr;
  if (pQVar1 == (QMapData<std::map<QString,_QVariant,_std::less<QString>,_std::allocator<std::pair<const_QString,_QVariant>_>_>_>
                 *)0x0) {
    p_Var3 = (_Rb_tree_node_base *)0x0;
  }
  else {
    p_Var3 = *(_Base_ptr *)((long)&(pQVar1->m)._M_t._M_impl.super__Rb_tree_header._M_header + 0x10);
  }
  p_Var4 = &(pQVar1->m)._M_t._M_impl.super__Rb_tree_header._M_header;
  if (pQVar1 == (QMapData<std::map<QString,_QVariant,_std::less<QString>,_std::allocator<std::pair<const_QString,_QVariant>_>_>_>
                 *)0x0) {
    p_Var4 = (_Rb_tree_node_base *)0x0;
  }
  for (; p_Var3 != p_Var4; p_Var3 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var3)) {
    pQVar2 = ::operator<<(s,(QString *)(p_Var3 + 1));
    ::operator<<(pQVar2,(QVariant *)&p_Var3[1]._M_right);
  }
  return s;
}

Assistant:

QDataStream &writeAssociativeContainer(QDataStream &s, const Container &c)
{
    if (!QDataStream::writeQSizeType(s, c.size()))
        return s;
    auto it = c.constBegin();
    auto end = c.constEnd();
    while (it != end) {
        s << it.key() << it.value();
        ++it;
    }

    return s;
}